

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128AsmJsLowerStoreElem(LowererMD *this,Instr *instr)

{
  byte dataWidth;
  OpCode OVar1;
  ValueType arrType;
  int iVar2;
  RegOpnd *pRVar3;
  LowererMD *this_00;
  LowererMD *this_01;
  Opnd *this_02;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  IndirOpnd *pIVar9;
  Instr *pIVar10;
  IntConstOpnd *this_03;
  char *this_04;
  
  OVar1 = instr->m_opcode;
  if ((((0x11 < OVar1 - 0x306) || ((0x3c003U >> (OVar1 - 0x306 & 0x1f) & 1) == 0)) &&
      ((0x27 < OVar1 - 0x345 || ((0xc000000003U >> ((ulong)(OVar1 - 0x345) & 0x3f) & 1) == 0)))) &&
     ((0x24 < OVar1 - 0x38e || ((0x1800000003U >> ((ulong)(OVar1 - 0x38e) & 0x3f) & 1) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xac8,
                       "(instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4"
                      );
    if (!bVar5) goto LAB_005ecf5d;
    *puVar8 = 0;
  }
  pIVar10 = instr->m_prev;
  pIVar9 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  pRVar3 = pIVar9->m_indexOpnd;
  pIVar9 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  this_00 = (LowererMD *)instr->m_dst;
  this_01 = (LowererMD *)instr->m_src1;
  this_02 = instr->m_src2;
  arrType.field_0 =
       (anon_union_2_4_ea848c7b_for_ValueType_13)
       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
        &(pIVar9->m_baseOpnd->super_Opnd).m_valueType.field_0.field_0;
  dataWidth = instr->dataWidth;
  bVar5 = IR::Opnd::IsSimd128((Opnd *)this_00);
  if (bVar5) {
    this_04 = (char *)this_01;
    bVar5 = IR::Opnd::IsSimd128((Opnd *)this_01);
    if ((!bVar5) || (this_02->m_type != TyUint32)) goto LAB_005ece27;
  }
  else {
LAB_005ece27:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    this_04 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xad4,
                       "(dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32)",
                       "dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32");
    if (!bVar5) {
LAB_005ecf5d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if (pRVar3 == (RegOpnd *)0x0) {
    this_04 = (char *)this_00;
    pIVar9 = IR::Opnd::AsIndirOpnd((Opnd *)this_00);
    if (pIVar9->m_offset + (uint)dataWidth < 0x1000001) {
      bVar5 = IR::Opnd::IsIntConstOpnd(this_02);
      if (bVar5) {
        pIVar9 = IR::Opnd::AsIndirOpnd((Opnd *)this_00);
        iVar2 = pIVar9->m_offset;
        this_03 = IR::Opnd::AsIntConstOpnd(this_02);
        uVar7 = IR::IntConstOpnd::AsUint32(this_03);
        if (uVar7 < iVar2 + (uint)dataWidth) {
          Lowerer::GenerateRuntimeError
                    (this->m_lowerer,instr,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
          IR::Instr::Remove(instr);
          return pIVar10;
        }
      }
      goto LAB_005ececb;
    }
  }
  bVar6 = Simd128GetTypedArrBytesPerElem((LowererMD *)this_04,arrType);
  LowererMDArch::LowerAsmJsStElemHelper(&this->lowererMDArch,instr,true,bVar6 != dataWidth);
LAB_005ececb:
  pIVar10 = Simd128ConvertToStore(this,(Opnd *)this_00,(Opnd *)this_01,dataWidth,instr,'\0');
  return pIVar10;
}

Assistant:

IR::Instr*
LowererMD::Simd128AsmJsLowerStoreElem(IR::Instr *instr)
{
    Assert(
        instr->m_opcode == Js::OpCode::Simd128_StArr_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_I16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_F4 ||
        //instr->m_opcode == Js::OpCode::Simd128_StArr_D2 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4
        //instr->m_opcode == Js::OpCode::Simd128_StArrConst_D2
        );

    IR::Instr * instrPrev = instr->m_prev;
    IR::RegOpnd * indexOpnd = instr->GetDst()->AsIndirOpnd()->GetIndexOpnd();
    IR::RegOpnd * baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();
    ValueType arrType = baseOpnd->GetValueType();
    uint8 dataWidth = instr->dataWidth;

    // Type-specialized.
    Assert(dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32);

    IR::Instr * done;

    if (indexOpnd || ((uint32)dst->AsIndirOpnd()->GetOffset() + dataWidth > 0x1000000))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $store
        // $helper:
        // Throw RangeError
        // JMP $done
        // $store:
        // MOV dst([arrayBuffer + indexOpnd]), src1
        // $done:
        uint32 bpe = Simd128GetTypedArrBytesPerElem(arrType);
        done = this->lowererMDArch.LowerAsmJsStElemHelper(instr, true, bpe != dataWidth);
    }
    else
    {
        // we might have a constant index if globopt propped a constant store. we can ahead of time check if it is in-bounds
        if (src2->IsIntConstOpnd() && ((uint32)dst->AsIndirOpnd()->GetOffset() + dataWidth > src2->AsIntConstOpnd()->AsUint32()))
        {
            m_lowerer->GenerateRuntimeError(instr, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);
            instr->Remove();
            return instrPrev;
        }
        done = instr;
    }

    return Simd128ConvertToStore(dst, src1, dataWidth, instr);
}